

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

void __thiscall V1Transport::Reset(V1Transport *this)

{
  long lVar1;
  char *in_RDI;
  DataStream *this_00;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            (in_RDI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
             (AnnotatedMixin<std::mutex> *)0x101fba1);
  DataStream::clear((DataStream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  this_00 = (DataStream *)(in_RDI + 0xd0);
  DataStream::clear((DataStream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  DataStream::resize(this_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (value_type)((ulong)in_RDI >> 0x38));
  in_RDI[200] = '\0';
  in_RDI[0x128] = '\0';
  in_RDI[0x129] = '\0';
  in_RDI[0x12a] = '\0';
  in_RDI[299] = '\0';
  in_RDI[300] = '\0';
  in_RDI[0x12d] = '\0';
  in_RDI[0x12e] = '\0';
  in_RDI[0x12f] = '\0';
  base_blob<256U>::SetNull((base_blob<256U> *)this_00);
  CHash256::Reset((CHash256 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Reset() EXCLUSIVE_LOCKS_REQUIRED(m_recv_mutex) {
        AssertLockHeld(m_recv_mutex);
        vRecv.clear();
        hdrbuf.clear();
        hdrbuf.resize(24);
        in_data = false;
        nHdrPos = 0;
        nDataPos = 0;
        data_hash.SetNull();
        hasher.Reset();
    }